

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLEBTensorOp.cpp
# Opt level: O2

void __thiscall amrex::MLEBTensorOp::prepareForSolve(MLEBTensorOp *this)

{
  ulong uVar1;
  pointer pVVar2;
  pointer paVar3;
  pointer pVVar4;
  pointer pMVar5;
  byte bVar6;
  uint uVar7;
  int mglev_2;
  long lVar8;
  long lVar9;
  int mglev;
  ulong uVar10;
  long lVar11;
  long lVar12;
  int amrlev_1;
  Array<const_MultiFab_*,_3> local_78;
  ulong local_60;
  undefined1 *local_54;
  int local_4c;
  Array<MultiFab_*,_3> local_48;
  
  bVar6 = (this->super_MLEBABecLap).field_0x3d5;
  if (bVar6 != (this->super_MLEBABecLap).field_0x3d6) {
    Assert_host("m_has_kappa == m_has_eb_kappa",
                "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/LinearSolvers/MLMG/AMReX_MLEBTensorOp.cpp"
                ,0x8f,
                "\"MLEBTensorOp: must call both setBulkViscosity and setEBBulkViscosity or none.\"")
    ;
    bVar6 = (this->super_MLEBABecLap).field_0x3d5;
  }
  if ((bVar6 & 1) == 0) {
    for (lVar11 = 0;
        lVar11 < (this->super_MLEBABecLap).super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.
                 m_num_amr_levels; lVar11 = lVar11 + 1) {
      lVar9 = 0;
      for (lVar12 = 0;
          pVVar2 = (this->m_kappa).
                   super_vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                   .
                   super__Vector_base<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
          lVar12 < ((long)*(pointer *)
                           ((long)&pVVar2[lVar11].
                                   super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                                   .
                                   super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                           + 8) -
                   *(long *)&pVVar2[lVar11].
                             super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                             .
                             super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                   ) / 0x480; lVar12 = lVar12 + 1) {
        for (lVar8 = 0; lVar8 != 0x480; lVar8 = lVar8 + 0x180) {
          FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                    ((FabArray<amrex::FArrayBox> *)
                     (*(long *)&(this->m_kappa).
                                super_vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                                .
                                super__Vector_base<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar11].
                                super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                                .
                                super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                      + lVar9 + lVar8),0.0);
        }
        lVar9 = lVar9 + 0x480;
      }
    }
  }
  else {
    uVar10 = (ulong)(uint)(this->super_MLEBABecLap).super_MLCellABecLap.super_MLCellLinOp.
                          super_MLLinOp.m_num_amr_levels;
    while (0 < (int)uVar10) {
      uVar1 = uVar10 - 1;
      lVar11 = 1;
      lVar9 = 0;
      local_60 = uVar10;
      while( true ) {
        pVVar2 = (this->m_kappa).
                 super_vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                 .
                 super__Vector_base<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar12 = *(long *)&pVVar2[uVar1].
                           super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                           .
                           super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
        ;
        paVar3 = *(pointer *)
                  ((long)&pVVar2[uVar1].
                          super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                          .
                          super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                  + 8);
        if (((long)paVar3 - lVar12) / 0x480 <= lVar11) break;
        local_78._M_elems[0] = (MultiFab *)(lVar12 + lVar9);
        local_78._M_elems[1] = (MultiFab *)(lVar12 + lVar9 + 0x180);
        local_78._M_elems[2] = (MultiFab *)(lVar12 + 0x300 + lVar9);
        lVar12 = *(long *)&pVVar2[uVar1].
                           super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                           .
                           super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
        ;
        local_48._M_elems[0] = (MultiFab *)(lVar12 + lVar9 + 0x480);
        local_48._M_elems[1] = (MultiFab *)(lVar12 + 0x600 + lVar9);
        local_48._M_elems[2] = (MultiFab *)(lVar12 + 0x780 + lVar9);
        local_54 = &DAT_200000002;
        local_4c = 2;
        EB_average_down_faces(&local_78,&local_48,(IntVect *)&local_54,0);
        lVar11 = lVar11 + 1;
        lVar9 = lVar9 + 0x480;
      }
      uVar10 = uVar1;
      if (local_60 != 1) {
        local_78._M_elems[0] = paVar3[-1]._M_elems;
        local_78._M_elems[1] = paVar3[-1]._M_elems + 1;
        local_78._M_elems[2] = paVar3[-1]._M_elems + 2;
        uVar7 = (int)local_60 - 2;
        local_48._M_elems[0] =
             *(MultiFab **)
              &pVVar2[uVar7].
               super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
               .
               super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
        ;
        local_48._M_elems[1] = local_48._M_elems[0] + 1;
        local_48._M_elems[2] = local_48._M_elems[0] + 2;
        local_54 = &DAT_200000002;
        local_4c = 2;
        EB_average_down_faces
                  (&local_78,&local_48,(IntVect *)&local_54,
                   *(Geometry **)
                    &(this->super_MLEBABecLap).super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.
                     m_geom.
                     super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     .
                     super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar7].
                     super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                     super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>);
      }
    }
  }
  if ((this->super_MLEBABecLap).field_0x3d6 == '\0') {
    for (lVar11 = 0;
        lVar11 < (this->super_MLEBABecLap).super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.
                 m_num_amr_levels; lVar11 = lVar11 + 1) {
      lVar12 = 0;
      lVar9 = 0;
      while( true ) {
        pVVar4 = (this->m_eb_kappa).
                 super_vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                 .
                 super__Vector_base<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar8 = *(long *)&pVVar4[lVar11].
                          super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                          super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>;
        if (((long)*(pointer *)
                    ((long)&pVVar4[lVar11].
                            super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                            super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> +
                    8) - lVar8) / 0x180 <= lVar9) break;
        FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)(lVar8 + lVar12),0.0);
        lVar9 = lVar9 + 1;
        lVar12 = lVar12 + 0x180;
      }
    }
  }
  else {
    uVar10 = (ulong)(uint)(this->super_MLEBABecLap).super_MLCellABecLap.super_MLCellLinOp.
                          super_MLLinOp.m_num_amr_levels;
    while (0 < (int)uVar10) {
      uVar1 = uVar10 - 1;
      lVar9 = 0x180;
      lVar11 = 1;
      local_60 = uVar10;
      while( true ) {
        pVVar4 = (this->m_eb_kappa).
                 super_vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                 .
                 super__Vector_base<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar12 = *(long *)&pVVar4[uVar1].
                           super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                           super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>;
        pMVar5 = *(pointer *)
                  ((long)&pVVar4[uVar1].
                          super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                          super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> + 8)
        ;
        if (((long)pMVar5 - lVar12) / 0x180 <= lVar11) break;
        local_78._M_elems[0] = (MultiFab *)&DAT_200000002;
        local_78._M_elems[1] = (MultiFab *)CONCAT44(local_78._M_elems[1]._4_4_,2);
        EB_average_down_boundaries
                  ((MultiFab *)(lVar12 + lVar9 + -0x180),(MultiFab *)(lVar12 + lVar9),
                   (IntVect *)&local_78,0);
        lVar11 = lVar11 + 1;
        lVar9 = lVar9 + 0x180;
      }
      uVar10 = uVar1;
      if (local_60 != 1) {
        local_78._M_elems[0] = (MultiFab *)&DAT_200000002;
        local_78._M_elems[1] = (MultiFab *)CONCAT44(local_78._M_elems[1]._4_4_,2);
        EB_average_down_boundaries
                  (pMVar5 + -1,
                   *(MultiFab **)
                    &pVVar4[local_60 - 2].
                     super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                     super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,
                   (IntVect *)&local_78,0);
      }
    }
  }
  for (lVar11 = 0;
      lVar11 < (this->super_MLEBABecLap).super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.
               m_num_amr_levels; lVar11 = lVar11 + 1) {
    lVar9 = 0;
    for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
      MultiFab::Xpay((MultiFab *)
                     (*(long *)&(this->super_MLEBABecLap).m_b_coeffs.
                                super_vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                                .
                                super__Vector_base<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar11].
                                super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                                .
                                super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                     + lVar9),1.3333333333333333,
                     (MultiFab *)
                     (*(long *)&(this->m_kappa).
                                super_vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                                .
                                super__Vector_base<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar11].
                                super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                                .
                                super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                     + lVar9),0,(int)lVar12,1,0);
      lVar9 = lVar9 + 0x180;
    }
  }
  MLEBABecLap::prepareForSolve(&this->super_MLEBABecLap);
  return;
}

Assistant:

void
MLEBTensorOp::prepareForSolve ()
{
    AMREX_ALWAYS_ASSERT_WITH_MESSAGE(m_has_kappa == m_has_eb_kappa,
        "MLEBTensorOp: must call both setBulkViscosity and setEBBulkViscosity or none.");

    if (m_has_kappa) {
        for (int amrlev = NAMRLevels()-1; amrlev >= 0; --amrlev) {
            for (int mglev = 1; mglev < m_kappa[amrlev].size(); ++mglev) {
                amrex::EB_average_down_faces(GetArrOfConstPtrs(m_kappa[amrlev][mglev-1]),
                                             GetArrOfPtrs     (m_kappa[amrlev][mglev  ]),
                                             IntVect(mg_coarsen_ratio), 0);
            }
            if (amrlev > 0) {
                amrex::EB_average_down_faces(GetArrOfConstPtrs(m_kappa[amrlev  ].back()),
                                             GetArrOfPtrs     (m_kappa[amrlev-1].front()),
                                             IntVect(mg_coarsen_ratio), m_geom[amrlev-1][0]);
            }
        }
    } else {
        for (int amrlev = 0; amrlev < NAMRLevels(); ++amrlev) {
            for (int mglev = 0; mglev < m_kappa[amrlev].size(); ++mglev) {
                for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
                    m_kappa[amrlev][mglev][idim].setVal(0.0);
                }
            }
        }
    }

    if (m_has_eb_kappa) {
        for (int amrlev = NAMRLevels()-1; amrlev >= 0; --amrlev) {
            for (int mglev = 1; mglev < m_eb_kappa[amrlev].size(); ++mglev) {
                amrex::EB_average_down_boundaries(m_eb_kappa[amrlev][mglev-1],
                                                  m_eb_kappa[amrlev][mglev  ],
                                                  IntVect(mg_coarsen_ratio), 0);
            }
            if (amrlev > 0) {
                amrex::EB_average_down_boundaries(m_eb_kappa[amrlev  ].back(),
                                                  m_eb_kappa[amrlev-1].front(),
                                                  IntVect(mg_coarsen_ratio), 0);
            }
        }
    } else {
        for (int amrlev = 0; amrlev < NAMRLevels(); ++amrlev) {
            for (int mglev = 0; mglev < m_eb_kappa[amrlev].size(); ++mglev) {
                m_eb_kappa[amrlev][mglev].setVal(0.0);
            }
        }
    }

    for (int amrlev = 0; amrlev < NAMRLevels(); ++amrlev) {
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
            int icomp = idim;
            MultiFab::Xpay(m_b_coeffs[amrlev][0][idim], 4./3.,
                           m_kappa[amrlev][0][idim], 0, icomp, 1, 0);
        }
    }

    MLEBABecLap::prepareForSolve();
}